

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ScopeRandomizeFunction::~ScopeRandomizeFunction(ScopeRandomizeFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ScopeRandomizeFunction((ScopeRandomizeFunction *)0x9522b8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ScopeRandomizeFunction() :
        SystemSubroutine(KnownSystemName::Randomize, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }